

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O1

int __thiscall
ztimer::TimerManager::RegisterAbsTimer(TimerManager *this,unsigned_long timerId,string *timePoint)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  time_point tVar4;
  long lVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  _Hash_node_base *local_28;
  
  local_28 = (_Hash_node_base *)timerId;
  tVar4 = Str2Time(this,timePoint);
  lVar5 = std::chrono::_V2::system_clock::now();
  iVar3 = 2;
  if (lVar5 <= (long)tVar4.__d.__r) {
    if (tVar4.__d.__r == 0) {
      iVar3 = 3;
    }
    else {
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      iVar3 = 1;
      if (local_28 != (_Hash_node_base *)0x0) {
        uVar1 = (this->timerMap)._M_h._M_bucket_count;
        uVar9 = (ulong)local_28 % uVar1;
        p_Var10 = (this->timerMap)._M_h._M_buckets[uVar9];
        p_Var11 = (__node_base_ptr)0x0;
        if ((p_Var10 != (__node_base_ptr)0x0) &&
           (p_Var2 = p_Var10->_M_nxt, p_Var11 = p_Var10, p_Var10->_M_nxt[1]._M_nxt != local_28)) {
          while (p_Var10 = p_Var2, p_Var2 = p_Var10->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
            p_Var11 = (__node_base_ptr)0x0;
            if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar9) ||
               (p_Var11 = p_Var10, p_Var2[1]._M_nxt == local_28)) goto LAB_0011ca3b;
          }
          p_Var11 = (__node_base_ptr)0x0;
        }
LAB_0011ca3b:
        if ((p_Var11 == (__node_base_ptr)0x0) || (p_Var11->_M_nxt == (_Hash_node_base *)0x0)) {
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->timerMap,(key_type *)&local_28);
          *pmVar6 = 0;
          pmVar7 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->AbsTimerMap,(key_type *)&local_28);
          (pmVar7->__d).__r = (rep)tVar4.__d.__r;
          pmVar8 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(this->timeWheel).
                                   super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(key_type *)&local_28);
          pmVar8->_M_elems[0] = 2;
          pmVar8->_M_elems[1] = 0;
          pmVar8->_M_elems[2] = 0;
          iVar3 = 0;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    }
  }
  return iVar3;
}

Assistant:

int TimerManager::RegisterAbsTimer(unsigned long timerId, const std::string& timePoint)
    {
        auto futureTime = Str2Time(timePoint);
        if (futureTime < Now()) {
            return ERR_TIME_POINT_LATE;
        }

        if (!TimePointValid(futureTime)) {
            return ERR_TIME_POINT_FMT;
        }
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_EXIST;
        }
        timerMap[timerId] = 0;
        AbsTimerMap[timerId] = futureTime;
        timeWheel[0][timerId] = {ABS_ONCE, 0, 0};
        return ERR_OK;
    }